

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

void dbuf_set(level *lev,int x,int y,rm *loc_override,int bg,int trap,int obj,int obj_mn,
             int obj_stacks,int obj_prize,int invis,int mon,int monflags,int effect)

{
  ushort uVar1;
  boolean bVar2;
  ushort uVar3;
  int iVar4;
  char *pcVar5;
  byte bVar6;
  ushort uVar7;
  uint uVar8;
  rm *prVar9;
  nh_dbuf_entry *pnVar10;
  xchar y_00;
  xchar x_00;
  
  if (0x14 < (uint)y || 0x4e < x - 1U) {
    return;
  }
  pnVar10 = dbuf[(uint)y] + (uint)x;
  prVar9 = lev->locations[(uint)x] + (uint)y;
  if (loc_override != (rm *)0x0) {
    prVar9 = loc_override;
  }
  if (bg == -1) {
    bg = *(uint *)prVar9 & 0x3f;
  }
  pnVar10->bg = (short)bg;
  if (trap == -1) {
    trap = *(uint *)prVar9 >> 6 & 0x1f;
  }
  pnVar10->trap = (short)trap;
  if (obj == -1) {
    obj = *(uint *)prVar9 >> 0xb & 0x3ff;
  }
  iVar4 = obfuscate_object(obj);
  pnVar10->obj = (short)iVar4;
  if (obj_mn == -1) {
    obj_mn = *(uint *)prVar9 >> 0x15 & 0x1ff;
  }
  pnVar10->obj_mn = (short)obj_mn;
  pnVar10->objflags = 0;
  if ((obj_stacks == 0) || ((obj_stacks == -1 && ((prVar9->field_0x3 & 0x40) == 0)))) {
    uVar3 = 0;
  }
  else {
    uVar3 = 1;
  }
  pnVar10->objflags = uVar3;
  if ((obj_prize != 0) && ((obj_prize != -1 || ((int)*(uint *)prVar9 < 0)))) {
    uVar3 = uVar3 | 2;
  }
  pnVar10->objflags = uVar3;
  if (invis == -1) {
    invis = *(uint *)&prVar9->field_0x6 >> 3 & 1;
  }
  pnVar10->invis = (nh_bool)invis;
  pnVar10->mon = (short)mon;
  pnVar10->monflags = (short)monflags;
  pnVar10->effect = effect;
  pnVar10->dgnflags = 0;
  if ((level == lev) && ((viz_array[(uint)y][(uint)x] & 2U) != 0)) {
    pnVar10->dgnflags = 1;
    uVar3 = 1;
  }
  else {
    uVar3 = 0;
  }
  if (((ushort)((short)bg - 0x1bU) < 2) && (prVar9->typ == '\x17')) {
    uVar8 = *(uint *)&prVar9->field_0x6 & 1;
    bVar6 = (byte)*(uint *)&prVar9->field_0x6 >> 7;
    uVar1 = bVar6 + 2 + (ushort)bVar6;
    if (uVar8 == 0) {
      uVar1 = (ushort)uVar8;
    }
    pnVar10->dgnflags = uVar3 | uVar1;
    uVar8 = *(uint *)&prVar9->field_0x6 & 2;
    uVar7 = ((ushort)(*(uint *)&prVar9->field_0x6 >> 5) & 8) + 8;
    if (uVar8 == 0) {
      uVar7 = (ushort)uVar8;
    }
    uVar7 = uVar7 | uVar3 | uVar1;
LAB_00166ba5:
    pnVar10->dgnflags = uVar7;
  }
  else if (prVar9->typ == '!') {
    uVar8 = *(uint *)&prVar9->field_0x6 >> 4 & 7;
    if (uVar8 == 0) {
      iVar4 = -0x80;
    }
    else if (uVar8 == 4) {
      iVar4 = 1;
    }
    else {
      iVar4 = uVar8 - 2;
    }
    bVar2 = on_level(&lev->z,&dungeon_topology.d_astral_level);
    uVar7 = 0;
    if (((bVar2 == '\0') && (iVar4 != -0x80)) && (uVar7 = 0x20, iVar4 != 1)) {
      uVar7 = (ushort)(iVar4 != 0) << 5 | 0x40;
    }
    uVar7 = uVar7 | pnVar10->dgnflags;
    goto LAB_00166ba5;
  }
  x_00 = (xchar)x;
  y_00 = (xchar)y;
  pcVar5 = in_rooms(lev,x_00,y_00,5);
  uVar3 = 0x80;
  if (*pcVar5 == '\0') {
    pcVar5 = in_rooms(lev,x_00,y_00,0xe);
    uVar3 = 0x100;
    if (*pcVar5 == '\0') {
      bVar2 = on_level(&lev->z,&dungeon_topology.d_minetown_level);
      if (bVar2 != '\0') {
        pcVar5 = in_rooms(lev,x_00,y_00,0);
        uVar3 = 0x180;
        if (*pcVar5 != '\0') goto LAB_00166be4;
      }
      bVar2 = In_W_tower(lev,x,y);
      uVar3 = 0x200;
      if (bVar2 == '\0') {
        return;
      }
    }
  }
LAB_00166be4:
  pnVar10->dgnflags = pnVar10->dgnflags | uVar3;
  return;
}

Assistant:

void dbuf_set(const struct level *lev, int x, int y,
	      const struct rm *loc_override,
	      int bg, int trap,
	      int obj, int obj_mn, int obj_stacks, int obj_prize,
	      int invis, int mon, int monflags,
	      int effect)
{
    struct nh_dbuf_entry *dbe;
    const struct rm *loc;

    if (!isok(x, y))
	return;

    dbe = &dbuf[y][x];
    loc = loc_override ? loc_override : &lev->locations[x][y];

    dbe->bg = (bg != -1) ? bg : loc->mem_bg;
    dbe->trap = (trap != -1) ? trap : loc->mem_trap;
    dbe->obj = obfuscate_object((obj != -1) ? obj : loc->mem_obj);
    dbe->obj_mn = (obj_mn != -1) ? obj_mn : loc->mem_obj_mn;

    dbe->objflags = DOBJ_NORMAL;
    if (obj_stacks == 0 || (obj_stacks == -1 && loc->mem_obj_stacks == 0))
	dbe->objflags &= ~DOBJ_STACKS;
    else
	dbe->objflags |= DOBJ_STACKS;
    if (obj_prize == 0 || (obj_prize == -1 && loc->mem_obj_prize == 0))
	dbe->objflags &= ~DOBJ_PRIZE;
    else
	dbe->objflags |= DOBJ_PRIZE;

    dbe->invis = (invis != -1) ? invis : loc->mem_invis;

    dbe->mon = mon;
    dbe->monflags = monflags;
    dbe->effect = effect;

    dbe->dgnflags = 0;

    if (lev == level && cansee(x, y))
	dbe->dgnflags |= NH_DF_VISIBLE_MASK;

    if (dbe->bg == S_hcdoor || dbe->bg == S_vcdoor) {
	if (!IS_DOOR(loc->typ)) {
	    dbe->dgnflags |= NH_DF_DOORLOCK_UNKNOWN;
	    dbe->dgnflags |= NH_DF_DOORTRAP_UNKNOWN;
	} else {
	    dbe->dgnflags |=
		    loc->mem_door_l == 0 ? NH_DF_DOORLOCK_UNKNOWN :
		    (loc->doormask & D_LOCKED) ? NH_DF_DOORLOCK_LOCKED :
		    NH_DF_DOORLOCK_UNLOCKED;
	    dbe->dgnflags |=
		    loc->mem_door_t == 0 ? NH_DF_DOORTRAP_UNKNOWN :
		    (loc->doormask & D_TRAPPED) ? NH_DF_DOORTRAP_TRAPPED :
		    NH_DF_DOORTRAP_UNTRAPPED;
	}
    }

    if (IS_ALTAR(loc->typ)) {
	aligntyp a = Amask2align(loc->altarmask & AM_MASK);
	dbe->dgnflags |=
		(Is_astralevel(&lev->z) || a == A_NONE) ? NH_DF_ALTARALIGN_OTHER :
		(a == A_LAWFUL) ? NH_DF_ALTARALIGN_LAWFUL :
		(a == A_NEUTRAL) ? NH_DF_ALTARALIGN_NEUTRAL :
		NH_DF_ALTARALIGN_CHAOTIC;
    }

    if (*in_rooms(lev, x, y, BEEHIVE))
	dbe->dgnflags |= NH_DF_BGHINT_BEEHIVE;
    else if (*in_rooms(lev, x, y, GARDEN))
	dbe->dgnflags |= NH_DF_BGHINT_GARDEN;
    else if (Is_minetown_level(&lev->z) && *in_rooms(lev, x, y, 0))
	dbe->dgnflags |= NH_DF_BGHINT_MINEROOM;
    else if (In_W_tower(lev, x, y))
	dbe->dgnflags |= NH_DF_BGHINT_WIZTOWER;
}